

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parseException.h
# Opt level: O3

string * AutoArgParse::UnexpectedArgException::makeErrorMessage
                   (string *__return_storage_ptr__,string *unexpectedArg,FlagStore *flagStore)

{
  ostream *poVar1;
  ostringstream os;
  ostringstream aoStack_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(aoStack_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)aoStack_198,"Unexpected argument: ",0x15);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)aoStack_198,(unexpectedArg->_M_dataplus)._M_p,
                      unexpectedArg->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)aoStack_198,"Valid option(s): ",0x11);
  printUnParsed((ostringstream *)aoStack_198,&flagStore->flagInsertionOrder,&flagStore->flags);
  printUnParsed((ostringstream *)aoStack_198,&flagStore->args);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_198);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

static std::string makeErrorMessage(const std::string& unexpectedArg,
                                        const FlagStore& flagStore) {
        std::ostringstream os;
        os << "Unexpected argument: " << unexpectedArg << std::endl;
        os << "Valid option(s): ";
        printUnParsed(os, flagStore.flagInsertionOrder, flagStore.flags);
        printUnParsed(os, flagStore.args);
        return os.str();
    }